

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall spdlog::details::scoped_padder::pad_it(scoped_padder *this,long count)

{
  string_view_t view;
  char *s;
  memory_buf_t *in_RSI;
  char *in_RDI;
  size_t unaff_retaddr;
  basic_string_view<char> local_20;
  
  s = ::fmt::v6::basic_string_view<char>::data((basic_string_view<char> *)(in_RDI + 0x18));
  ::fmt::v6::basic_string_view<char>::basic_string_view(&local_20,s,(size_t)in_RSI);
  view.size_ = unaff_retaddr;
  view.data_ = in_RDI;
  fmt_helper::append_string_view(view,in_RSI);
  return;
}

Assistant:

void pad_it(long count)
    {
        fmt_helper::append_string_view(string_view_t(spaces_.data(), static_cast<size_t>(count)), dest_);
    }